

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsModelsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryKinematicsModelsLoader::beginAttachment
          (LibraryKinematicsModelsLoader *this,Type attachmentType,
          attachment_AttributeData *attributeData)

{
  void *pvVar1;
  KinematicLink *this_00;
  undefined8 *in_RDX;
  long in_RDI;
  KinematicLink *link;
  String joint;
  KinematicAttachment *in_stack_fffffffffffffee8;
  SidAddress *in_stack_fffffffffffffef0;
  SidAddress *joint_00;
  String *sidAddress;
  KinematicAttachment *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined1 local_39 [57];
  
  joint_00 = (SidAddress *)*in_RDX;
  sidAddress = (String *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (allocator<char> *)in_stack_ffffffffffffff20);
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  pvVar1 = operator_new(0xe0);
  SidAddress::SidAddress((SidAddress *)in_stack_ffffffffffffff20,sidAddress);
  KinematicAttachment::KinematicAttachment
            (in_stack_ffffffffffffff20,(Type)((ulong)sidAddress >> 0x20),joint_00);
  *(void **)(in_RDI + 0x208) = pvVar1;
  SidAddress::~SidAddress(in_stack_fffffffffffffef0);
  this_00 = (KinematicLink *)
            std::
            stack<COLLADASaxFWL::KinematicLink_*,_std::deque<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>_>
            ::top((stack<COLLADASaxFWL::KinematicLink_*,_std::deque<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>_>
                   *)0xb1d09e);
  KinematicLink::addAttachment(this_00,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  return true;
}

Assistant:

bool LibraryKinematicsModelsLoader::beginAttachment( KinematicAttachment::Type attachmentType, const attachment_AttributeData& attributeData )
	{
		String joint(attributeData.joint);
		mCurrentAttachment = new KinematicAttachment( attachmentType, joint);
		COLLADABU_ASSERT( !mLinkStack.empty() );
		KinematicLink* link = mLinkStack.top();
		link->addAttachment( mCurrentAttachment );
		return true;
	}